

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogToTTY(int max_depth)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == false) {
    pIVar1 = GImGui->CurrentWindow;
    GImGui->LogEnabled = true;
    pIVar2->LogFile = _stdout;
    pIVar2->LogStartDepth = (pIVar1->DC).TreeDepth;
    if (-1 < max_depth) {
      pIVar2->LogAutoExpandMaxDepth = max_depth;
    }
  }
  return;
}

Assistant:

void ImGui::LogToTTY(int max_depth)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = GetCurrentWindowRead();

    g.LogEnabled = true;
    g.LogFile = stdout;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}